

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnmatch.cc
# Opt level: O3

bool absl::lts_20240722::log_internal::FNMatch(string_view pattern,string_view str)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  size_t sVar5;
  char *__str;
  ulong uVar6;
  ulong __n;
  ulong uVar7;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  pcVar4 = str._M_str;
  sVar5 = str._M_len;
  __str = pattern._M_str;
  uVar7 = pattern._M_len;
  if (uVar7 != 0) {
    bVar2 = false;
    local_38._M_len = sVar5;
    local_38._M_str = pcVar4;
    do {
      if (sVar5 == 0) {
        uVar6 = 0;
        goto LAB_00101216;
      }
      cVar1 = *__str;
      if (cVar1 == '?') {
LAB_001011a5:
        __str = __str + 1;
        uVar7 = uVar7 - 1;
        pcVar4 = pcVar4 + 1;
        sVar5 = sVar5 - 1;
        local_38._M_len = sVar5;
        local_38._M_str = pcVar4;
      }
      else if (cVar1 == '*') {
        __str = __str + 1;
        uVar7 = uVar7 - 1;
        bVar2 = true;
      }
      else {
        if (!bVar2) {
          if (cVar1 != *pcVar4) {
            return false;
          }
          goto LAB_001011a5;
        }
        uVar6 = 0;
        do {
          if ((__str[uVar6] == '*') || (__str[uVar6] == '?')) {
            __n = uVar6;
            if (uVar7 < uVar6) {
              __n = uVar7;
            }
            break;
          }
          uVar6 = uVar6 + 1;
          __n = uVar7;
        } while (uVar7 != uVar6);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_38,__str,0,__n);
        if (sVar3 == 0xffffffffffffffff) {
          return false;
        }
        __str = __str + __n;
        uVar7 = uVar7 - __n;
        pcVar4 = local_38._M_str + sVar3 + __n;
        sVar5 = local_38._M_len - (sVar3 + __n);
        bVar2 = false;
        local_38._M_len = sVar5;
        local_38._M_str = pcVar4;
      }
    } while (uVar7 != 0);
    if (bVar2) {
      return true;
    }
  }
  return sVar5 == 0;
  while (uVar6 = uVar6 + 1, uVar7 != uVar6) {
LAB_00101216:
    if (__str[uVar6] != '*') goto LAB_0010122b;
  }
  uVar6 = 0xffffffffffffffff;
LAB_0010122b:
  return uVar6 == 0xffffffffffffffff;
}

Assistant:

bool FNMatch(absl::string_view pattern, absl::string_view str) {
  bool in_wildcard_match = false;
  while (true) {
    if (pattern.empty()) {
      // `pattern` is exhausted; succeed if all of `str` was consumed matching
      // it.
      return in_wildcard_match || str.empty();
    }
    if (str.empty()) {
      // `str` is exhausted; succeed if `pattern` is empty or all '*'s.
      return pattern.find_first_not_of('*') == pattern.npos;
    }
    switch (pattern.front()) {
      case '*':
        pattern.remove_prefix(1);
        in_wildcard_match = true;
        break;
      case '?':
        pattern.remove_prefix(1);
        str.remove_prefix(1);
        break;
      default:
        if (in_wildcard_match) {
          absl::string_view fixed_portion = pattern;
          const size_t end = fixed_portion.find_first_of("*?");
          if (end != fixed_portion.npos) {
            fixed_portion = fixed_portion.substr(0, end);
          }
          const size_t match = str.find(fixed_portion);
          if (match == str.npos) {
            return false;
          }
          pattern.remove_prefix(fixed_portion.size());
          str.remove_prefix(match + fixed_portion.size());
          in_wildcard_match = false;
        } else {
          if (pattern.front() != str.front()) {
            return false;
          }
          pattern.remove_prefix(1);
          str.remove_prefix(1);
        }
        break;
    }
  }
}